

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

QString * __thiscall QTabBar::tabWhatsThis(QString *__return_storage_ptr__,QTabBar *this,int index)

{
  long lVar1;
  Data *pDVar2;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (((ulong)(long)index < *(ulong *)(lVar1 + 0x2e8)) &&
     (lVar1 = *(long *)(*(long *)(lVar1 + 0x2e0) + (long)index * 8), lVar1 != 0)) {
    pDVar2 = *(Data **)(lVar1 + 0x30);
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = *(char16_t **)(lVar1 + 0x38);
    (__return_storage_ptr__->d).size = *(qsizetype *)(lVar1 + 0x40);
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      return __return_storage_ptr__;
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QTabBar::tabWhatsThis(int index) const
{
    Q_D(const QTabBar);
    if (const QTabBarPrivate::Tab *tab = d->at(index))
        return tab->whatsThis;
    return QString();
}